

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int32_t iVar13;
  fpclass_type fVar14;
  int32_t iVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  int start_00;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  int *piVar29;
  int iVar30;
  long lVar31;
  ulong uVar28;
  
  uVar21 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar26 = end - 1;
    uVar28 = (ulong)uVar26;
    uVar19 = uVar26 - start;
    if (0x18 < (int)uVar19) {
LAB_00324bb4:
      start_00 = (int)uVar21;
      iVar20 = (uVar19 >> 1) + start_00;
      pNVar1 = keys + iVar20;
      iVar20 = keys[iVar20].idx;
      iVar27 = (int)uVar28;
      lVar18 = (long)iVar27;
      lVar17 = (long)start_00;
      uVar24 = uVar28;
      uVar23 = uVar21;
      do {
        iVar30 = (int)uVar23;
        iVar22 = (int)uVar24;
        if ((type & 1U) == 0) {
          if (iVar30 < iVar27) {
            piVar29 = &keys[iVar30].idx;
            lVar31 = 0;
            do {
              bVar16 = EQ(*piVar29,iVar20);
              if ((!bVar16) && (iVar20 <= *piVar29)) {
                uVar23 = (ulong)(uint)(iVar30 - (int)lVar31);
                break;
              }
              lVar31 = lVar31 + -1;
              piVar29 = piVar29 + 0xf;
              uVar23 = uVar28;
            } while ((long)iVar30 + -lVar18 != lVar31);
          }
          if (start_00 < iVar22) {
            uVar19 = (uint)uVar23;
            uVar23 = (ulong)iVar22;
            piVar29 = &keys[uVar23].idx;
            do {
              bVar16 = EQ(*piVar29,iVar20);
              uVar24 = uVar23;
              if ((bVar16) || (*piVar29 < iVar20)) break;
              uVar23 = uVar23 - 1;
              piVar29 = piVar29 + -0xf;
              uVar24 = uVar21;
            } while (lVar17 < (long)uVar23);
LAB_00324d4f:
            uVar23 = (ulong)uVar19;
          }
        }
        else {
          if (iVar30 < iVar27) {
            piVar29 = &keys[iVar30].idx;
            lVar31 = 0;
            do {
              bVar16 = EQ(*piVar29,iVar20);
              if ((bVar16) || (iVar20 <= *piVar29)) {
                uVar23 = (ulong)(uint)(iVar30 - (int)lVar31);
                break;
              }
              lVar31 = lVar31 + -1;
              piVar29 = piVar29 + 0xf;
              uVar23 = uVar28;
            } while ((long)iVar30 + -lVar18 != lVar31);
          }
          uVar19 = (uint)uVar23;
          if (start_00 < iVar22) {
            uVar23 = (ulong)iVar22;
            piVar29 = &keys[uVar23].idx;
            do {
              bVar16 = EQ(*piVar29,iVar20);
              if ((!bVar16) && (uVar24 = uVar23, *piVar29 < iVar20)) break;
              uVar23 = uVar23 - 1;
              piVar29 = piVar29 + -0xf;
              uVar24 = uVar21;
            } while (lVar17 < (long)uVar23);
            goto LAB_00324d4f;
          }
        }
        iVar30 = (int)uVar23;
        iVar22 = (int)uVar24;
        if (iVar22 <= iVar30) goto LAB_00324e2a;
        uVar5 = *(undefined8 *)(keys[iVar30].val.m_backend.data._M_elems + 8);
        uVar6 = *(undefined8 *)keys[iVar30].val.m_backend.data._M_elems;
        uVar7 = *(undefined8 *)(keys[iVar30].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar30].val.m_backend.data._M_elems + 4;
        uVar8 = *(undefined8 *)puVar2;
        uVar9 = *(undefined8 *)(puVar2 + 2);
        iVar3 = keys[iVar30].val.m_backend.exp;
        bVar16 = keys[iVar30].val.m_backend.neg;
        iVar4 = keys[iVar30].idx;
        uVar10 = *(undefined8 *)(keys[iVar22].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar22].val.m_backend.data._M_elems + 4;
        uVar11 = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        *(undefined8 *)keys[iVar30].val.m_backend.data._M_elems =
             *(undefined8 *)keys[iVar22].val.m_backend.data._M_elems;
        *(undefined8 *)(keys[iVar30].val.m_backend.data._M_elems + 2) = uVar10;
        puVar2 = keys[iVar30].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar11;
        *(undefined8 *)(puVar2 + 2) = uVar12;
        *(undefined8 *)(keys[iVar30].val.m_backend.data._M_elems + 8) =
             *(undefined8 *)(keys[iVar22].val.m_backend.data._M_elems + 8);
        keys[iVar30].val.m_backend.exp = keys[iVar22].val.m_backend.exp;
        keys[iVar30].val.m_backend.neg = keys[iVar22].val.m_backend.neg;
        keys[iVar30].idx = keys[iVar22].idx;
        *(undefined8 *)(keys[iVar22].val.m_backend.data._M_elems + 8) = uVar5;
        puVar2 = keys[iVar22].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar8;
        *(undefined8 *)(puVar2 + 2) = uVar9;
        *(undefined8 *)keys[iVar22].val.m_backend.data._M_elems = uVar6;
        *(undefined8 *)(keys[iVar22].val.m_backend.data._M_elems + 2) = uVar7;
        keys[iVar22].val.m_backend.exp = iVar3;
        keys[iVar22].val.m_backend.neg = bVar16;
        fVar14 = keys[iVar30].val.m_backend.fpclass;
        iVar15 = keys[iVar30].val.m_backend.prec_elem;
        iVar13 = keys[iVar22].val.m_backend.prec_elem;
        keys[iVar30].val.m_backend.fpclass = keys[iVar22].val.m_backend.fpclass;
        keys[iVar30].val.m_backend.prec_elem = iVar13;
        keys[iVar22].val.m_backend.fpclass = fVar14;
        keys[iVar22].val.m_backend.prec_elem = iVar15;
        keys[iVar22].idx = iVar4;
        uVar23 = (ulong)(iVar30 + 1);
        uVar24 = (ulong)(iVar22 - 1);
      } while( true );
    }
LAB_003250c7:
    if (0 < (int)uVar19) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar26,compare,start);
      return;
    }
  }
  return;
LAB_00324e2a:
  if ((type & 1U) == 0) {
    if (start_00 < iVar22) {
      uVar25 = (ulong)iVar22;
      piVar29 = &keys[uVar25].idx;
      do {
        bVar16 = EQ(iVar20,*piVar29);
        if ((!bVar16) && (uVar24 = uVar25, *piVar29 <= iVar20)) break;
        uVar25 = uVar25 - 1;
        piVar29 = piVar29 + -0xf;
        uVar24 = uVar21;
      } while (lVar17 < (long)uVar25);
    }
    if ((int)uVar24 == iVar27) {
      uVar5 = *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[lVar18].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar18].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar20 = keys[lVar18].val.m_backend.exp;
      bVar16 = keys[lVar18].val.m_backend.neg;
      iVar22 = keys[lVar18].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[lVar18].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[lVar18].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[lVar18].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[lVar18].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar18].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar18].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar20;
      (pNVar1->val).m_backend.neg = bVar16;
      fVar14 = keys[lVar18].val.m_backend.fpclass;
      iVar15 = keys[lVar18].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar18].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar18].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar22;
      uVar24 = (ulong)(iVar27 - 1);
    }
  }
  else {
    if (iVar30 < iVar27) {
      piVar29 = &keys[iVar30].idx;
      lVar31 = 0;
      do {
        bVar16 = EQ(iVar20,*piVar29);
        if ((!bVar16) && (iVar20 < *piVar29)) {
          uVar23 = (ulong)(uint)(iVar30 - (int)lVar31);
          break;
        }
        lVar31 = lVar31 + -1;
        piVar29 = piVar29 + 0xf;
        uVar23 = uVar28;
      } while (iVar30 - lVar18 != lVar31);
    }
    if ((int)uVar23 == start_00) {
      uVar5 = *(undefined8 *)(keys[lVar17].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[lVar17].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[lVar17].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar17].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar20 = keys[lVar17].val.m_backend.exp;
      bVar16 = keys[lVar17].val.m_backend.neg;
      iVar22 = keys[lVar17].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[lVar17].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar17].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[lVar17].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[lVar17].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[lVar17].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar17].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar17].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar20;
      (pNVar1->val).m_backend.neg = bVar16;
      fVar14 = keys[lVar17].val.m_backend.fpclass;
      iVar15 = keys[lVar17].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar17].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar17].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar22;
      uVar23 = (ulong)(start_00 + 1);
    }
  }
  iVar20 = (int)uVar24;
  uVar19 = iVar20 - start_00;
  iVar22 = (int)uVar23;
  uVar26 = iVar27 - iVar22;
  if ((int)uVar26 < (int)uVar19) {
    uVar28 = uVar24 & 0xffffffff;
    uVar23 = uVar21;
    uVar26 = uVar19;
    iVar20 = iVar27;
    start_00 = iVar22;
    if (iVar27 <= iVar22) goto LAB_003250b2;
  }
  else {
    uVar21 = uVar23;
    uVar19 = uVar26;
    if (iVar20 <= start_00) goto LAB_003250b2;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,iVar20 + 1,compare,start_00,(bool)(~type & 1));
  uVar21 = uVar23;
  uVar19 = uVar26;
LAB_003250b2:
  uVar26 = (uint)uVar28;
  start = (int)uVar21;
  type = (bool)(type ^ 1);
  if ((int)uVar19 < 0x19) goto LAB_003250c7;
  goto LAB_00324bb4;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}